

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picojson.h
# Opt level: O2

bool picojson::
     _parse<picojson::default_parse_context,std::istreambuf_iterator<char,std::char_traits<char>>>
               (default_parse_context *ctx,
               input<std::istreambuf_iterator<char,_std::char_traits<char>_>_> *in)

{
  bool bVar1;
  int iVar2;
  FILE *__stream;
  input<std::istreambuf_iterator<char,_std::char_traits<char>_>_> *in_00;
  FILE *__stream_00;
  double f;
  char *local_48;
  char *endp;
  string num_str;
  
  __stream_00 = (FILE *)in;
  input<std::istreambuf_iterator<char,_std::char_traits<char>_>_>::skip_ws(in);
  iVar2 = input<std::istreambuf_iterator<char,_std::char_traits<char>_>_>::getc(in,__stream_00);
  if (iVar2 == 0x22) {
    bVar1 = default_parse_context::
            parse_string<std::istreambuf_iterator<char,std::char_traits<char>>>(ctx,in);
    return bVar1;
  }
  if (iVar2 == 0x5b) {
    bVar1 = _parse_array<picojson::default_parse_context,std::istreambuf_iterator<char,std::char_traits<char>>>
                      (ctx,in);
    return bVar1;
  }
  if (iVar2 == 0x66) {
    std::__cxx11::string::string((string *)&endp,"alse",(allocator *)&local_48);
    bVar1 = input<std::istreambuf_iterator<char,_std::char_traits<char>_>_>::match
                      (in,(string *)&endp);
    if (!bVar1) goto LAB_00117e9c;
    bVar1 = default_parse_context::set_bool(ctx,false);
  }
  else {
    if (iVar2 == 0x7b) {
      bVar1 = _parse_object<picojson::default_parse_context,std::istreambuf_iterator<char,std::char_traits<char>>>
                        (ctx,in);
      return bVar1;
    }
    if (iVar2 == 0x74) {
      std::__cxx11::string::string((string *)&endp,"rue",(allocator *)&local_48);
      bVar1 = input<std::istreambuf_iterator<char,_std::char_traits<char>_>_>::match
                        (in,(string *)&endp);
      if (!bVar1) goto LAB_00117e9c;
      bVar1 = default_parse_context::set_bool(ctx,true);
    }
    else {
      if (iVar2 != 0x6e) {
        if (iVar2 != 0x2d && 9 < iVar2 - 0x30U) {
          input<std::istreambuf_iterator<char,_std::char_traits<char>_>_>::ungetc
                    (in,(int)__stream_00,__stream);
          return false;
        }
        input<std::istreambuf_iterator<char,_std::char_traits<char>_>_>::ungetc
                  (in,(int)__stream_00,__stream);
        _parse_number<std::istreambuf_iterator<char,std::char_traits<char>>>
                  ((string *)&endp,(picojson *)in,in_00);
        if ((num_str._M_dataplus._M_p == (pointer)0x0) ||
           (f = strtod(endp,&local_48), local_48 != endp + (long)num_str._M_dataplus._M_p)) {
          bVar1 = false;
        }
        else {
          bVar1 = true;
          default_parse_context::set_number(ctx,f);
        }
        std::__cxx11::string::~string((string *)&endp);
        return bVar1;
      }
      std::__cxx11::string::string((string *)&endp,"ull",(allocator *)&local_48);
      bVar1 = input<std::istreambuf_iterator<char,_std::char_traits<char>_>_>::match
                        (in,(string *)&endp);
      if (!bVar1) {
LAB_00117e9c:
        std::__cxx11::string::~string((string *)&endp);
        return false;
      }
      bVar1 = default_parse_context::set_null(ctx);
    }
  }
  std::__cxx11::string::~string((string *)&endp);
  if (bVar1 == false) {
    return false;
  }
  return true;
}

Assistant:

inline bool _parse(Context& ctx, input<Iter>& in) {
    in.skip_ws();
    int ch = in.getc();
    switch (ch) {
#define IS(ch, text, op) case ch: \
      if (in.match(text) && op) { \
    return true; \
      } else { \
    return false; \
      }
      IS('n', "ull", ctx.set_null());
      IS('f', "alse", ctx.set_bool(false));
      IS('t', "rue", ctx.set_bool(true));
#undef IS
    case '"':
      return ctx.parse_string(in);
    case '[':
      return _parse_array(ctx, in);
    case '{':
      return _parse_object(ctx, in);
    default:
      if (('0' <= ch && ch <= '9') || ch == '-') {
        double f;
        char *endp;
    in.ungetc();
        std::string num_str = _parse_number(in);
        if (num_str.empty()) {
          return false;
        }
#ifdef PICOJSON_USE_INT64
        {
          errno = 0;
          intmax_t ival = strtoimax(num_str.c_str(), &endp, 10);
          if (errno == 0
              && std::numeric_limits<int64_t>::min() <= ival
              && ival <= std::numeric_limits<int64_t>::max()
              && endp == num_str.c_str() + num_str.size()) {
            ctx.set_int64(ival);
            return true;
          }
        }
#endif
        f = strtod(num_str.c_str(), &endp);
        if (endp == num_str.c_str() + num_str.size()) {
          ctx.set_number(f);
          return true;
        }
        return false;
      }
      break;
    }
    in.ungetc();
    return false;
  }